

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFieldName
          (FastFieldValuePrinter *this,Message *message,Reflection *reflection,
          FieldDescriptor *field,BaseTextGenerator *generator)

{
  Type TVar1;
  string *psVar2;
  Descriptor *pDVar3;
  undefined8 *puVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 uVar5;
  char *pcVar6;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar5 = 1;
    (*generator->_vptr_BaseTextGenerator[5])(generator,"[",1);
    psVar2 = FieldDescriptor::PrintableNameForExtension_abi_cxx11_(field);
    (*generator->_vptr_BaseTextGenerator[5])
              (generator,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    UNRECOVERED_JUMPTABLE = generator->_vptr_BaseTextGenerator[5];
    pcVar6 = "]";
  }
  else {
    TVar1 = FieldDescriptor::type(field);
    if (TVar1 == TYPE_GROUP) {
      pDVar3 = FieldDescriptor::message_type(field);
      puVar4 = *(undefined8 **)pDVar3;
    }
    else {
      puVar4 = *(undefined8 **)field;
    }
    pcVar6 = (char *)*puVar4;
    uVar5 = puVar4[1];
    UNRECOVERED_JUMPTABLE = generator->_vptr_BaseTextGenerator[5];
  }
  (*UNRECOVERED_JUMPTABLE)(generator,pcVar6,uVar5);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFieldName(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, BaseTextGenerator* generator) const {
  if (field->is_extension()) {
    generator->PrintLiteral("[");
    generator->PrintString(field->PrintableNameForExtension());
    generator->PrintLiteral("]");
  } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
    // Groups must be serialized with their original capitalization.
    generator->PrintString(field->message_type()->name());
  } else {
    generator->PrintString(field->name());
  }
}